

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall
pbrt::TextureSceneEntity::TextureSceneEntity
          (TextureSceneEntity *this,string *texName,ParameterDictionary *parameters,FileLoc loc,
          AnimatedTransform *renderFromObject)

{
  allocator<char> local_a9;
  string local_a8;
  ParameterDictionary local_88;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  ParameterDictionary::ParameterDictionary(&local_88,parameters);
  TransformedSceneEntity::TransformedSceneEntity
            (&this->super_TransformedSceneEntity,&local_a8,&local_88,loc,renderFromObject);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_88.params);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&this->texName,(string *)texName);
  return;
}

Assistant:

TextureSceneEntity(const std::string &texName, ParameterDictionary parameters,
                       FileLoc loc, const AnimatedTransform &renderFromObject)
        : TransformedSceneEntity("", std::move(parameters), loc, renderFromObject),
          texName(texName) {}